

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsCommon.h
# Opt level: O0

void __thiscall
Scs::Allocator<Scs::Server::ClientConnection>::destroy
          (Allocator<Scs::Server::ClientConnection> *this,pointer ptr)

{
  ClientConnection *local_18;
  pointer ptr_local;
  Allocator<Scs::Server::ClientConnection> *this_local;
  
  local_18 = ptr;
  ptr_local = (pointer)this;
  unused<Scs::Server::ClientConnection*>(&local_18);
  Server::ClientConnection::~ClientConnection(local_18);
  return;
}

Assistant:

void destroy(pointer ptr) { Scs::unused(ptr); ptr->~T(); }